

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

bool helics::changeDetected(defV *prevValue,string_view val,double param_3)

{
  int iVar1;
  variant_alternative_t<2UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar2;
  bool bVar3;
  size_t __n;
  size_type __rlen;
  
  __n = val._M_len;
  bVar3 = true;
  if (((prevValue->
       super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
       ).
       super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
       .
       super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
       .
       super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
       .
       super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
       .
       super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
       ._M_index == '\x02') &&
     (pvVar2 = std::
               get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         (prevValue), pvVar2->_M_string_length == __n)) {
    if ((__n != 0) && (iVar1 = bcmp(val._M_str,(pvVar2->_M_dataplus)._M_p,__n), iVar1 != 0)) {
      return true;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool changeDetected(const defV& prevValue, std::string_view val, double /*deltaV*/)
{
    if (prevValue.index() == string_loc) {
        return (val != std::get<std::string>(prevValue));
    }
    return true;
}